

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O0

void (anonymous_namespace)::buildCommand((anonymous_namespace)::BuildContext&,llbuild::ninja::
     Command*)::NinjaCommandTask::writeDescription((anonymous_namespace)::BuildContext&,llbuild::
     ninja::Command__(BuildContext *context,Command *command)

{
  Command *this;
  undefined8 uVar1;
  undefined8 uVar2;
  Pool *pPVar3;
  pointer this_00;
  Pool *pPVar4;
  string *local_48;
  string local_40;
  string *local_20;
  string *description;
  Command *command_local;
  BuildContext *context_local;
  
  description = (string *)command;
  command_local = (Command *)context;
  if ((context->verbose & 1U) == 0) {
    local_48 = llbuild::ninja::Command::getEffectiveDescription_abi_cxx11_(command);
  }
  else {
    local_48 = llbuild::ninja::Command::getCommandString_abi_cxx11_(command);
  }
  this = command_local;
  local_20 = local_48;
  *(int *)&(command_local->depsFile).field_0x4 = *(int *)&(command_local->depsFile).field_0x4 + 1;
  anon_unknown.dwarf_83ee8::BuildContext::statusLinePrefix
            (&local_40,(BuildContext *)command_local,(string *)&command_local->executionPool);
  uVar1 = std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::c_str();
  anon_unknown.dwarf_83ee8::BuildContext::emitStatus((BuildContext *)this,"%s%s",uVar1,uVar2);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar3 = llbuild::ninja::Command::getExecutionPool((Command *)description);
  this_00 = std::
            unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>::
            operator->((unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                        *)&(command_local->parameters).field_0x18);
  pPVar4 = llbuild::ninja::Manifest::getConsolePool(this_00);
  if (pPVar3 == pPVar4) {
    llbuild::commands::CommandLineStatusOutput::finishLine
              ((CommandLineStatusOutput *)&command_local->rspFile);
  }
  return;
}

Assistant:

static void writeDescription(BuildContext& context,
                                 ninja::Command* command) {
      const std::string& description =
        context.verbose ? command->getCommandString() :
        command->getEffectiveDescription();
      ++context.numOutputDescriptions;
      context.emitStatus("%s%s",
        context.statusLinePrefix(context.statusLinePrefixFormat).c_str(),
        description.c_str());

      // Whenever we write a description for a console job, make sure to finish
      // the output under the expectation that the console job might write to
      // the output. We don't make any attempt to lock this in case the console
      // job can run concurrently with anything else.
      if (command->getExecutionPool() == context.manifest->getConsolePool()) {
        context.statusOutput.finishLine();
      }
    }